

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

string * __thiscall
cmFindProgramCommand::FindProgram
          (string *__return_storage_ptr__,cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  ulong uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58;
  allocator local_22;
  undefined1 local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmFindProgramCommand *this_local;
  string *program;
  
  local_21 = 0;
  local_20 = names;
  names_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this;
  this_local = (cmFindProgramCommand *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  if ((((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleFirst & 1U) != 0) ||
     (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly & 1U) != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_70,names);
    FindAppBundle(&local_58,this,&local_70);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly & 1U) == 0)) {
    cmsys::SystemTools::FindProgram
              (&local_90,names,&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,true);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleLast & 1U) != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,names);
    FindAppBundle(&local_b0,this,&local_c8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindProgram(std::vector<std::string> names)
{
  std::string program = "";

  if(this->SearchAppBundleFirst || this->SearchAppBundleOnly)
    {
    program = FindAppBundle(names);
    }
  if(program.empty() && !this->SearchAppBundleOnly)
    {
    program = cmSystemTools::FindProgram(names, this->SearchPaths, true);
    }

  if(program.empty() && this->SearchAppBundleLast)
    {
    program = this->FindAppBundle(names);
    }
  return program;
}